

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O0

void __thiscall Peeps::SetReg(Peeps *this,RegNum reg,StackSym *sym)

{
  StackSym *sym_local;
  RegNum reg_local;
  Peeps *this_local;
  
  ClearReg(this,reg);
  if ((*(uint *)&sym->field_0x18 >> 0x1c & 1) == 0) {
    ClearReg(this,(sym->scratch).peeps.reg);
    this->regMap[reg] = sym;
    (sym->scratch).peeps.reg = reg;
  }
  return;
}

Assistant:

void
Peeps::SetReg(RegNum reg, StackSym *sym)
{
    this->ClearReg(reg);

    if (sym->m_isClosureSym)
    {
        return;
    }

    this->ClearReg(sym->scratch.peeps.reg);
    this->regMap[reg] = sym;
    sym->scratch.peeps.reg = reg;
}